

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

void __thiscall
glcts::ViewportArray::APIErrors::depthRangeArrayHelper<float>
          (APIErrors *this,DepthFuncWrapper *depthFunc,GLint max_viewports,bool *test_result,
          float *param_4)

{
  long lVar1;
  long lVar2;
  vector<float,_std::allocator<float>_> data;
  vector<float,_std::allocator<float>_> local_48;
  
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (GLfloat *)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize(&local_48,(long)(max_viewports * 2));
  if (0 < max_viewports) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      *(undefined4 *)
       ((long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start + (lVar1 >> 0x1e)) = 0;
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[(int)lVar2 + 1] = 1.0;
      lVar2 = lVar2 + 2;
      lVar1 = lVar1 + 0x200000000;
    } while ((ulong)(uint)max_viewports * 2 != lVar2);
  }
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (0,max_viewports + -1,
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0,"depthRangeArray, correct parameters",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (max_viewports,1,
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (1,max_viewports + -1,
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0,"depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS",test_result);
  (*depthFunc->m_gl->depthRangeArrayfvOES)
            (1,max_viewports,
             local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start);
  checkGLError(this,0x501,"depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS",test_result);
  if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (GLfloat *)0x0) {
    operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void APIErrors::depthRangeArrayHelper(Utils::DepthFuncWrapper& depthFunc, GLint max_viewports, bool& test_result, T*)
{
	std::vector<T> data;
	data.resize(max_viewports * 2 /* near + far */);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		data[i * 2]		= (T)0.0;
		data[i * 2 + 1] = (T)1.0;
	}

	depthFunc.depthRangeArray(0, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, correct parameters", test_result);

	depthFunc.depthRangeArray(max_viewports, 1, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports - 1, &data[0]);
	checkGLError(GL_NO_ERROR, "depthRangeArray, <first> + <count> == GL_MAX_VIEWPORTS", test_result);

	depthFunc.depthRangeArray(1, max_viewports, &data[0]);
	checkGLError(GL_INVALID_VALUE, "depthRangeArray, <first> + <count> > GL_MAX_VIEWPORTS", test_result);
}